

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr64.cpp
# Opt level: O2

void __thiscall icu_63::UVector64::UVector64(UVector64 *this,UErrorCode *status)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__UVector64_003a87c0;
  this->count = 0;
  this->capacity = 0;
  this->maxCapacity = 0;
  this->elements = (int64_t *)0x0;
  _init(this,8,status);
  return;
}

Assistant:

UVector64::UVector64(UErrorCode &status) :
    count(0),
    capacity(0),
    maxCapacity(0),
    elements(NULL)
{
    _init(DEFAULT_CAPACITY, status);
}